

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_arm.c
# Opt level: O2

uc_err reg_write_arm(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uint32_t reg;
  uint uVar1;
  long lVar2;
  ARMCPRegInfo *pAVar3;
  uint32_t uVar4;
  CPWriteFn *pCVar5;
  uint32_t uVar6;
  uc_err uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (regid - 0x42 < 0xd) {
    if (3 < *size) {
      *size = 4;
      *(undefined4 *)((long)_env + (ulong)(regid - 0x42) * 4) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x32 < 0x10) {
    if (0xf < *size) {
      *size = 0x10;
      lVar2 = (ulong)(regid - 0x32) * 0x10;
      *(undefined8 *)((long)_env + lVar2 + 0xc10) = *value;
      *(undefined8 *)((long)_env + lVar2 + 0xc18) = *(undefined8 *)((long)value + 8);
      return UC_ERR_OK;
    }
  }
  else if (regid - 0xe < 0x20) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)
       ((long)_env + (ulong)(regid & 1) * 8 + (ulong)(regid - 0xe >> 1) * 0x10 + 0xc10) = *value;
      return UC_ERR_OK;
    }
  }
  else {
    uVar1 = regid - 0x4f;
    if (uVar1 < 0x20) {
      if (3 < *size) {
        *size = 4;
        uVar9 = 0xffffffff;
        uVar8 = (ulong)*value << 0x20;
        if ((uVar1 & 1) == 0) {
          uVar9 = 0xffffffff00000000;
          uVar8 = (ulong)*value;
        }
        *(ulong *)((long)_env + (ulong)(uVar1 & 2) * 4 + (ulong)(uVar1 >> 2) * 0x10 + 0xc10) =
             uVar9 & *(ulong *)((long)_env +
                               (ulong)(uVar1 & 2) * 4 + (ulong)(uVar1 >> 2) * 0x10 + 0xc10) | uVar8;
        return UC_ERR_OK;
      }
    }
    else {
      switch(regid) {
      case 0x71:
        if (3 < *size) {
          *size = 4;
          *(long *)((long)_env + 0x548) = (long)*value;
          return UC_ERR_OK;
        }
        break;
      case 0x72:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 8;
          reg = 5;
          goto LAB_004fe2a8;
        }
        break;
      case 0x73:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 8;
LAB_004fe284:
          helper_v7m_msr_arm((CPUARMState *)_env,uVar6,uVar4);
          return UC_ERR_OK;
        }
        break;
      case 0x74:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 9;
          goto LAB_004fe284;
        }
        break;
      case 0x75:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 0x14;
          goto LAB_004fe284;
        }
        break;
      case 0x76:
      case 0x82:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 8;
LAB_004fe17f:
          reg = 1;
LAB_004fe2a8:
          v7m_msr_xpsr((CPUARMState *)_env,uVar6,reg,uVar4);
          return UC_ERR_OK;
        }
        break;
      case 0x77:
      case 0x85:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 8;
LAB_004fe2a5:
          reg = 2;
          goto LAB_004fe2a8;
        }
        break;
      case 0x78:
      case 0x88:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 8;
LAB_004fe0dd:
          reg = 3;
          goto LAB_004fe2a8;
        }
        break;
      case 0x79:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 8;
          reg = 6;
          goto LAB_004fe2a8;
        }
        break;
      case 0x7a:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 8;
          reg = 7;
          goto LAB_004fe2a8;
        }
        break;
      case 0x7b:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 0x10;
          goto LAB_004fe284;
        }
        break;
      case 0x7c:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 0x11;
          goto LAB_004fe284;
        }
        break;
      case 0x7d:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 0x12;
          goto LAB_004fe284;
        }
        break;
      case 0x7e:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 0x13;
          goto LAB_004fe284;
        }
        break;
      case 0x7f:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
LAB_004fe12f:
          uVar6 = 8;
LAB_004fe25f:
          v7m_msr_xpsr((CPUARMState *)_env,uVar6,0,uVar4);
          return UC_ERR_OK;
        }
        break;
      case 0x80:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 4;
          goto LAB_004fe25f;
        }
        break;
      case 0x81:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 0xc;
          goto LAB_004fe25f;
        }
        break;
      case 0x83:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 4;
          goto LAB_004fe17f;
        }
        break;
      case 0x84:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 0xc;
          goto LAB_004fe17f;
        }
        break;
      case 0x86:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 4;
          goto LAB_004fe2a5;
        }
        break;
      case 0x87:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 0xc;
          goto LAB_004fe2a5;
        }
        break;
      case 0x89:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 4;
          goto LAB_004fe0dd;
        }
        break;
      case 0x8a:
        if (3 < *size) {
          *size = 4;
          uVar4 = *value;
          uVar6 = 0xc;
          goto LAB_004fe0dd;
        }
        break;
      case 0x8b:
        if (0x27 < *size) {
          *size = 0x28;
          pAVar3 = get_arm_cp_reginfo_arm
                             (*(GHashTable **)
                               (*(long *)(*(long *)((long)_env + 0x1128) + 0x1a0) + 0xb420),
                              *(int *)((long)value + 0x14) << 3 |
                              *(int *)((long)value + 0x10) << 7 |
                              *(int *)((long)value + 0xc) << 0xb |
                              *(int *)((long)value + 4) << 0xf | *value << 0x10 |
                              (uint)(*(int *)((long)value + 8) == 0) << 0x1d |
                              *(uint *)((long)value + 0x18));
          if (pAVar3 == (ARMCPRegInfo *)0x0) {
            uVar7 = UC_ERR_ARG;
          }
          else {
            if (*(int *)((long)value + 4) == 0) {
              *(undefined4 *)((long)value + 0x24) = 0;
            }
            pCVar5 = pAVar3->raw_writefn;
            if ((pCVar5 == (CPWriteFn *)0x0) &&
               (pCVar5 = pAVar3->writefn, pCVar5 == (CPWriteFn *)0x0)) {
              if ((pAVar3->state == 1) || ((pAVar3->type & 4) != 0)) {
                *(undefined8 *)((long)_env + pAVar3->fieldoffset) =
                     *(undefined8 *)((long)value + 0x20);
              }
              else {
                *(undefined4 *)((long)_env + pAVar3->fieldoffset) =
                     *(undefined4 *)((long)value + 0x20);
              }
            }
            else {
              (*pCVar5)((CPUARMState *)_env,pAVar3,*(uint64_t *)((long)value + 0x20));
            }
            uVar7 = UC_ERR_OK;
          }
          arm_rebuild_hflags_arm((CPUARMState *)_env);
          return uVar7;
        }
        break;
      default:
        uVar7 = UC_ERR_ARG;
        switch(regid) {
        case 1:
          if (3 < *size) {
            *size = 4;
            uVar4 = *value;
            if ((*(byte *)((long)_env + 0xfa1) & 2) == 0) {
              uVar6 = 0xf80f0000;
              goto LAB_004fdff4;
            }
            goto LAB_004fe12f;
          }
          break;
        case 2:
          if (3 < *size) {
            *size = 4;
            uVar4 = *value;
            uVar6 = 0xf0000000;
LAB_004fdff4:
            cpsr_write_arm((CPUARMState *)_env,uVar4,uVar6,CPSRWriteByUnicorn);
            arm_rebuild_hflags_arm((CPUARMState *)_env);
            return UC_ERR_OK;
          }
          break;
        case 3:
          if (3 < *size) {
            *size = 4;
            uVar4 = *value;
            uVar6 = 0xffffffff;
            goto LAB_004fdff4;
          }
          break;
        case 4:
          if (3 < *size) {
            *size = 4;
            *(undefined4 *)((long)_env + 0xe48) = *value;
            return UC_ERR_OK;
          }
          break;
        default:
          goto switchD_004fded0_caseD_5;
        case 6:
          if (3 < *size) {
            *size = 4;
            vfp_set_fpscr_arm((CPUARMState *)_env,*value);
            return UC_ERR_OK;
          }
          break;
        case 8:
          if (3 < *size) {
            *size = 4;
            *(undefined4 *)((long)_env + 0xe28) = *value;
            return UC_ERR_OK;
          }
          break;
        case 10:
          if (3 < *size) {
            *size = 4;
            *(undefined4 *)((long)_env + 0x38) = *value;
            return UC_ERR_OK;
          }
          break;
        case 0xb:
          if (3 < *size) {
            *size = 4;
            uVar1 = *value;
            *(ulong *)((long)_env + 0x140) = (ulong)(uVar1 & 0xfffffffe);
            *(uint *)((long)_env + 0x220) = uVar1 & 1;
            *(uint *)(*(long *)((long)_env + 0x1128) + 0x788) = *value & 1;
            *(uint *)((long)_env + 0x3c) = *value & 0xfffffffe;
            *setpc = 1;
            return UC_ERR_OK;
          }
          break;
        case 0xc:
          if (3 < *size) {
            *size = 4;
            *(undefined4 *)((long)_env + 0x34) = *value;
            return UC_ERR_OK;
          }
          break;
        case 0xd:
          if (3 < *size) {
            *size = 4;
            *(undefined4 *)((long)_env + 0x158) = *value;
            return UC_ERR_OK;
          }
        }
      }
    }
  }
  uVar7 = UC_ERR_OVERFLOW;
switchD_004fded0_caseD_5:
  return uVar7;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUARMState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_ARM_REG_R0 && regid <= UC_ARM_REG_R12) {
        CHECK_REG_TYPE(uint32_t);
        env->regs[regid - UC_ARM_REG_R0] = *(uint32_t *)value;
    } else if (regid >= UC_ARM_REG_Q0 && regid <= UC_ARM_REG_Q15) {
        CHECK_REG_TYPE(uint64_t[2]);
        uint32_t reg_index = regid - UC_ARM_REG_Q0;
        env->vfp.zregs[reg_index].d[0] = *(uint64_t *)value;
        env->vfp.zregs[reg_index].d[1] = *(((uint64_t *)value) + 1);
    } else if (regid >= UC_ARM_REG_D0 && regid <= UC_ARM_REG_D31) {
        CHECK_REG_TYPE(uint64_t);
        uint32_t reg_index = regid - UC_ARM_REG_D0;
        env->vfp.zregs[reg_index / 2].d[reg_index & 1] = *(uint64_t *)value;
    } else if (regid >= UC_ARM_REG_S0 && regid <= UC_ARM_REG_S31) {
        CHECK_REG_TYPE(uint32_t);
        uint32_t reg_index = regid - UC_ARM_REG_S0;
        uint64_t *p_reg_value =
            &env->vfp.zregs[reg_index / 4].d[reg_index % 4 / 2];
        uint64_t in_value = *((uint32_t *)value);
        if (reg_index % 2 == 0) {
            in_value |= *p_reg_value & 0xffffffff00000000ul;
        } else {
            in_value = (in_value << 32) | (*p_reg_value & 0xfffffffful);
        }

        *p_reg_value = in_value;
    } else {
        switch (regid) {
        case UC_ARM_REG_APSR:
            CHECK_REG_TYPE(uint32_t);
            if (!arm_feature(env, ARM_FEATURE_M)) {
                cpsr_write(env, *(uint32_t *)value,
                           (CPSR_NZCV | CPSR_Q | CPSR_GE), CPSRWriteByUnicorn);
                arm_rebuild_hflags(env);
            } else {
                // Same with UC_ARM_REG_APSR_NZCVQ
                v7m_msr_xpsr(env, 0b1000, 0, *(uint32_t *)value);
            }
            break;
        case UC_ARM_REG_APSR_NZCV:
            CHECK_REG_TYPE(uint32_t);
            cpsr_write(env, *(uint32_t *)value, CPSR_NZCV, CPSRWriteByUnicorn);
            arm_rebuild_hflags(env);
            break;
        case UC_ARM_REG_CPSR:
            CHECK_REG_TYPE(uint32_t);
            cpsr_write(env, *(uint32_t *)value, ~0, CPSRWriteByUnicorn);
            arm_rebuild_hflags(env);
            break;
        case UC_ARM_REG_SPSR:
            CHECK_REG_TYPE(uint32_t);
            env->spsr = *(uint32_t *)value;
            break;
        // case UC_ARM_REG_SP:
        case UC_ARM_REG_R13:
            CHECK_REG_TYPE(uint32_t);
            env->regs[13] = *(uint32_t *)value;
            break;
        // case UC_ARM_REG_LR:
        case UC_ARM_REG_R14:
            CHECK_REG_TYPE(uint32_t);
            env->regs[14] = *(uint32_t *)value;
            break;
        // case UC_ARM_REG_PC:
        case UC_ARM_REG_R15:
            CHECK_REG_TYPE(uint32_t);
            env->pc = (*(uint32_t *)value & ~1);
            env->thumb = (*(uint32_t *)value & 1);
            env->uc->thumb = (*(uint32_t *)value & 1);
            env->regs[15] = (*(uint32_t *)value & ~1);
            *setpc = 1;
            break;
            // case UC_ARM_REG_C1_C0_2:
            //     env->cp15.c1_coproc = *(int32_t *)value;
            //     break;

        case UC_ARM_REG_C13_C0_3:
            CHECK_REG_TYPE(int32_t);
            env->cp15.tpidrro_el[0] = *(int32_t *)value;
            break;
        case UC_ARM_REG_FPEXC:
            CHECK_REG_TYPE(int32_t);
            env->vfp.xregs[ARM_VFP_FPEXC] = *(int32_t *)value;
            break;
        case UC_ARM_REG_FPSCR:
            CHECK_REG_TYPE(int32_t);
            vfp_set_fpscr(env, *(int32_t *)value);
            break;
        case UC_ARM_REG_FPSID:
            CHECK_REG_TYPE(int32_t);
            env->vfp.xregs[ARM_VFP_FPSID] = *(int32_t *)value;
            break;
        case UC_ARM_REG_IPSR:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 5, *(uint32_t *)value);
            break;
        case UC_ARM_REG_MSP:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 8, *(uint32_t *)value);
            break;
        case UC_ARM_REG_PSP:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 9, *(uint32_t *)value);
            break;
        case UC_ARM_REG_CONTROL:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 20, *(uint32_t *)value);
            break;
        case UC_ARM_REG_EPSR:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 6, *(uint32_t *)value);
            break;
        case UC_ARM_REG_IEPSR:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 7, *(uint32_t *)value);
            break;
        case UC_ARM_REG_PRIMASK:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 16, *(uint32_t *)value);
            break;
        case UC_ARM_REG_BASEPRI:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 17, *(uint32_t *)value);
            break;
        case UC_ARM_REG_BASEPRI_MAX:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 18, *(uint32_t *)value);
            break;
        case UC_ARM_REG_FAULTMASK:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 19, *(uint32_t *)value);
            break;
        case UC_ARM_REG_APSR_NZCVQ:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 0, *(uint32_t *)value);
            break;
        case UC_ARM_REG_APSR_G:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b0100, 0, *(uint32_t *)value);
            break;
        case UC_ARM_REG_APSR_NZCVQG:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1100, 0, *(uint32_t *)value);
            break;
        case UC_ARM_REG_IAPSR:
        case UC_ARM_REG_IAPSR_NZCVQ:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 1, *(uint32_t *)value);
            break;
        case UC_ARM_REG_IAPSR_G:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b0100, 1, *(uint32_t *)value);
            break;
        case UC_ARM_REG_IAPSR_NZCVQG:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1100, 1, *(uint32_t *)value);
            break;
        case UC_ARM_REG_EAPSR:
        case UC_ARM_REG_EAPSR_NZCVQ:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 2, *(uint32_t *)value);
            break;
        case UC_ARM_REG_EAPSR_G:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b0100, 2, *(uint32_t *)value);
            break;
        case UC_ARM_REG_EAPSR_NZCVQG:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1100, 2, *(uint32_t *)value);
            break;
        case UC_ARM_REG_XPSR:
        case UC_ARM_REG_XPSR_NZCVQ:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 3, *(uint32_t *)value);
            break;
        case UC_ARM_REG_XPSR_G:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b0100, 3, *(uint32_t *)value);
            break;
        case UC_ARM_REG_XPSR_NZCVQG:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1100, 3, *(uint32_t *)value);
            break;
        case UC_ARM_REG_CP_REG:
            CHECK_REG_TYPE(uc_arm_cp_reg);
            ret = write_cp_reg(env, (uc_arm_cp_reg *)value);
            arm_rebuild_hflags_arm(env);
            break;
        }
    }

    return ret;
}